

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Partial.cpp
# Opt level: O3

bool __thiscall
MT32Emu::Partial::doProduceOutput<float,MT32Emu::LA32FloatPartialPair>
          (Partial *this,float *leftBuf,float *rightBuf,Bit32u length,
          LA32FloatPartialPair *la32PairImpl)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  long lVar5;
  float fVar6;
  
  bVar2 = canProduceOutput(this);
  if (bVar2) {
    this->alreadyOutputed = true;
    this->sampleNum = 0;
    if (length != 0) {
      lVar5 = 0;
      do {
        bVar3 = generateNextSample<MT32Emu::LA32FloatPartialPair>(this,la32PairImpl);
        if (!bVar3) break;
        fVar6 = LA32FloatPartialPair::nextOutSample(la32PairImpl);
        iVar1 = this->rightPanValue;
        *(float *)((long)leftBuf + lVar5) =
             ((float)this->leftPanValue * fVar6) / 14.0 + *(float *)((long)leftBuf + lVar5);
        *(float *)((long)rightBuf + lVar5) =
             ((float)iVar1 * fVar6) / 14.0 + *(float *)((long)rightBuf + lVar5);
        uVar4 = this->sampleNum + 1;
        this->sampleNum = uVar4;
        lVar5 = lVar5 + 4;
      } while (uVar4 < length);
    }
    this->sampleNum = 0;
  }
  return bVar2;
}

Assistant:

bool Partial::doProduceOutput(Sample *leftBuf, Sample *rightBuf, Bit32u length, LA32PairImpl *la32PairImpl) {
	if (!canProduceOutput()) return false;
	alreadyOutputed = true;

	for (sampleNum = 0; sampleNum < length; sampleNum++) {
		if (!generateNextSample(la32PairImpl)) break;
		produceAndMixSample(leftBuf, rightBuf, la32PairImpl);
	}
	sampleNum = 0;
	return true;
}